

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_state.cpp
# Opt level: O2

vector<lua_State_*,_std::allocator<lua_State_*>_> *
FindAllCoroutine(vector<lua_State_*,_std::allocator<lua_State_*>_> *__return_storage_ptr__,
                lua_State *L)

{
  switch(luaVersion) {
  default:
    (__return_storage_ptr__->super__Vector_base<lua_State_*,_std::allocator<lua_State_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<lua_State_*,_std::allocator<lua_State_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<lua_State_*,_std::allocator<lua_State_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    break;
  case LUA_51:
    FindAllCoroutine_lua51(__return_storage_ptr__,(lua_State_conflict2 *)L);
    break;
  case LUA_52:
    FindAllCoroutine_lua52(__return_storage_ptr__,(lua_State_conflict1 *)L);
    break;
  case LUA_53:
    FindAllCoroutine_lua53(__return_storage_ptr__,(lua_State_conflict *)L);
    break;
  case LUA_54:
    FindAllCoroutine_lua54(__return_storage_ptr__,L);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<lua_State*> FindAllCoroutine(lua_State* L)
{
	LuaSwitchDo(
		std::vector<lua_State*>(),
		FindAllCoroutine_lua51(L),
		FindAllCoroutine_lua52(L),
		FindAllCoroutine_lua53(L),
		FindAllCoroutine_lua54(L),
		std::vector<lua_State*>()
	);
}